

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# password.c
# Opt level: O1

int to_base64(char *str,size_t str_len,size_t out_len)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  void *__ptr;
  long lVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  char *pcVar9;
  
  __ptr = malloc(((str_len * 4) / 3 + 3 & 0xfffffffffffffffc) + 1);
  if (__ptr == (void *)0x0) {
    iVar6 = -1;
    if (-1 < msgno) {
      to_base64_cold_1();
    }
  }
  else {
    if (str_len == 0) {
      uVar7 = 0;
      uVar3 = 0;
      iVar6 = 0;
    }
    else {
      iVar6 = 0;
      uVar3 = 0;
      uVar7 = 0;
      sVar8 = 0;
      do {
        uVar3 = (int)str[sVar8] | uVar3 << 8;
        if (iVar6 < -2) {
          iVar6 = iVar6 + 8;
        }
        else {
          pcVar9 = (char *)((long)(int)uVar7 + (long)__ptr);
          iVar2 = iVar6 + 0xe;
          do {
            iVar6 = iVar2;
            *pcVar9 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [(int)uVar3 >> ((char)iVar6 - 0xcU & 0x1f) & 0x3f];
            pcVar9 = pcVar9 + 1;
            uVar7 = uVar7 + 1;
            iVar2 = iVar6 + -6;
          } while (0xb < iVar6 + -6);
          iVar6 = iVar6 + -0xc;
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 != str_len);
    }
    if (0 < iVar6) {
      lVar4 = (long)(int)uVar7;
      uVar7 = uVar7 + 1;
      *(char *)((long)__ptr + lVar4) =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [uVar3 << (6U - (char)iVar6 & 0x1f) & 0x3f];
    }
    uVar3 = uVar7;
    if ((uVar7 & 3) != 0) {
      memset((void *)((long)__ptr + (long)(int)uVar7),0x3d,(ulong)(4 - (uVar7 & 3)));
      uVar3 = (uVar7 | 3) + 1;
      do {
        uVar7 = uVar7 + 1;
      } while ((uVar7 & 3) != 0);
    }
    if ((ulong)(long)(int)uVar3 < out_len) {
LAB_00101bb5:
      free(__ptr);
      iVar6 = -1;
    }
    else {
      if (out_len == 0) {
        out_len = 0;
      }
      else {
        sVar8 = 0;
        do {
          cVar1 = *(char *)((long)__ptr + sVar8);
          cVar5 = '.';
          if ((cVar1 != '+') && (cVar5 = cVar1, cVar1 == '=')) goto LAB_00101bb5;
          str[sVar8] = cVar5;
          sVar8 = sVar8 + 1;
        } while (out_len != sVar8);
      }
      iVar6 = (int)out_len;
      free(__ptr);
    }
  }
  return iVar6;
}

Assistant:

static int
to_base64(char *str, size_t str_len, const size_t out_len)
{
    char *b = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
    char *buffer;
    size_t i;
    int n = 0, x = 0, l = 0;

    buffer = (char *)malloc(((str_len * 4 / 3 + 3) & ~0x03) + 1);
    if (!buffer) {
        msg_error(hash, "memory allocate\n");
        return -1;
    }

    for (i = 0; i < str_len; i++) {
        x = x << 8 | str[i];
        for (l += 8; l >= 6; l -= 6) {
            buffer[n++] = b[(x >> (l - 6)) & 0x3f];
        }
    }

    if (l > 0) {
        x <<= 6 - l;
        buffer[n++] = b[x & 0x3f];
    }

    for (; n % 4;) {
        buffer[n++] = '=';
    }

    if ((size_t)n < out_len) {
        free(buffer);
        return -1;
    }

    for (i = 0; i < out_len; i++) {
        if (buffer[i] == '+') {
            str[i] = '.';
        } else if (buffer[i] == '=') {
            free(buffer);
            return -1;
        } else {
            str[i] = buffer[i];
        }
    }

    free(buffer);

    return i;
}